

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O2

Span * __thiscall
tcmalloc::FixedAllocator<tcmalloc::Span>::AllocFromArea(FixedAllocator<tcmalloc::Span> *this)

{
  Span *pSVar1;
  uint64_t uVar2;
  
  if (this->area_free_ < 0x48) {
    pSVar1 = (Span *)SystemAlloc(0x8000000);
    if (pSVar1 == (Span *)0xffffffffffffffff) {
      return (Span *)0x0;
    }
    uVar2 = 0x7ffffb8;
  }
  else {
    pSVar1 = (Span *)this->area_;
    uVar2 = this->area_free_ - 0x48;
  }
  this->area_ = (char *)(pSVar1 + 1);
  this->area_free_ = uVar2;
  return pSVar1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }